

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

_Bool cs_insn_group(csh ud,cs_insn *insn,uint group_id)

{
  cs_struct *handle;
  uint group_id_local;
  cs_insn *insn_local;
  csh ud_local;
  
  if (ud == 0) {
    ud_local._7_1_ = false;
  }
  else if (*(int *)(ud + 0x68) == 0) {
    *(undefined4 *)(ud + 0x58) = 7;
    ud_local._7_1_ = false;
  }
  else if (insn->id == 0) {
    *(undefined4 *)(ud + 0x58) = 0xb;
    ud_local._7_1_ = false;
  }
  else if (insn->detail == (cs_detail *)0x0) {
    *(undefined4 *)(ud + 0x58) = 7;
    ud_local._7_1_ = false;
  }
  else {
    ud_local._7_1_ = arr_exist(insn->detail->groups,insn->detail->groups_count,group_id);
  }
  return ud_local._7_1_;
}

Assistant:

CAPSTONE_EXPORT
bool cs_insn_group(csh ud, const cs_insn *insn, unsigned int group_id)
{
	struct cs_struct *handle;
	if (!ud)
		return false;

	handle = (struct cs_struct *)(uintptr_t)ud;

	if (!handle->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	if(!insn->id) {
		handle->errnum = CS_ERR_SKIPDATA;
		return false;
	}

	if(!insn->detail) {
		handle->errnum = CS_ERR_DETAIL;
		return false;
	}

	return arr_exist(insn->detail->groups, insn->detail->groups_count, group_id);
}